

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.cpp
# Opt level: O3

string_t duckdb::BarScalarFunction(double x,double min,double max,double max_width,string *result)

{
  bool bVar1;
  OutOfRangeException *pOVar2;
  pointer __src;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double input;
  string_t sVar7;
  string local_80;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  uint local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  
  local_60 = x;
  local_58 = max_width;
  local_48 = max;
  local_40 = min;
  if (BarScalarFunction(double,double,double,double,std::__cxx11::string&)::FULL_BLOCK == '\0') {
    BarScalarFunction();
  }
  if (BarScalarFunction(double,double,double,double,std::__cxx11::string&)::PARTIAL_BLOCKS == '\0')
  {
    BarScalarFunction();
  }
  bVar1 = Value::IsFinite<double>(local_58);
  if (!bVar1) {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Max bar width must not be NaN or infinity","");
    OutOfRangeException::OutOfRangeException(pOVar2,&local_80);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_58 < 1.0) {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Max bar width must be >= 1","");
    OutOfRangeException::OutOfRangeException(pOVar2,&local_80);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_58 <= 1000.0) {
    bVar1 = Value::IsNan<double>(local_60);
    input = 0.0;
    if (!bVar1) {
      bVar1 = Value::IsNan<double>(local_40);
      if (bVar1) {
        input = 0.0;
      }
      else {
        bVar1 = Value::IsNan<double>(local_48);
        input = 0.0;
        if ((local_40 < local_60 && !bVar1) && (input = local_58, local_60 < local_48)) {
          input = ((local_60 - local_40) * local_58) / (local_48 - local_40);
        }
      }
    }
    local_60 = input;
    bVar1 = Value::IsFinite<double>(input);
    if (bVar1) {
      result->_M_string_length = 0;
      *(result->_M_dataplus)._M_p = '\0';
      uVar5 = (ulong)(local_60 * 8.0);
      if ((uint)uVar5 < 8) {
        uVar6 = 0;
      }
      else {
        uVar6 = uVar5 >> 3 & 0x1fffffff;
        uVar4 = uVar6;
        do {
          ::std::__cxx11::string::append((char *)result);
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      if ((uVar5 & 7) != 0) {
        uVar6 = uVar6 + 1;
        ::std::__cxx11::string::append((char *)result);
      }
      uVar5 = (long)(local_58 - 9.223372036854776e+18) & (long)local_58 >> 0x3f | (long)local_58;
      lVar3 = uVar5 - uVar6;
      if (uVar6 <= uVar5 && lVar3 != 0) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_80,(char)lVar3);
        ::std::__cxx11::string::_M_append((char *)result,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      __src = (result->_M_dataplus)._M_p;
      local_38 = (uint)result->_M_string_length;
      if (local_38 < 0xd) {
        local_2c = 0;
        uStack_34 = 0;
        uStack_30 = 0;
        if (local_38 == 0) {
          __src = (pointer)0x0;
        }
        else {
          switchD_00b041bd::default(&uStack_34,__src,(ulong)(local_38 & 0xf));
          __src = (pointer)CONCAT44(local_2c,uStack_30);
        }
      }
      else {
        uStack_34 = *(undefined4 *)__src;
      }
      sVar7.value._4_1_ = (undefined1)uStack_34;
      sVar7.value._5_1_ = uStack_34._1_1_;
      sVar7.value._6_1_ = uStack_34._2_1_;
      sVar7.value._7_1_ = uStack_34._3_1_;
      sVar7.value.pointer.length = local_38;
      sVar7.value.pointer.ptr = __src;
      return (string_t)sVar7.value;
    }
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Bar width must not be NaN or infinity","");
    OutOfRangeException::OutOfRangeException(pOVar2,&local_80);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Max bar width must be <= 1000","");
  OutOfRangeException::OutOfRangeException(pOVar2,&local_80);
  __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string_t BarScalarFunction(double x, double min, double max, double max_width, string &result) {
	static const char *FULL_BLOCK = UnicodeBar::FullBlock();
	static const char *const *PARTIAL_BLOCKS = UnicodeBar::PartialBlocks();
	static const idx_t PARTIAL_BLOCKS_COUNT = UnicodeBar::PartialBlocksCount();

	if (!Value::IsFinite(max_width)) {
		throw OutOfRangeException("Max bar width must not be NaN or infinity");
	}
	if (max_width < 1) {
		throw OutOfRangeException("Max bar width must be >= 1");
	}
	if (max_width > 1000) {
		throw OutOfRangeException("Max bar width must be <= 1000");
	}

	double width;

	if (Value::IsNan(x) || Value::IsNan(min) || Value::IsNan(max) || x <= min) {
		width = 0;
	} else if (x >= max) {
		width = max_width;
	} else {
		width = max_width * (x - min) / (max - min);
	}

	if (!Value::IsFinite(width)) {
		throw OutOfRangeException("Bar width must not be NaN or infinity");
	}

	result.clear();
	idx_t used_blocks = 0;

	auto width_as_int = LossyNumericCast<uint32_t>(width * PARTIAL_BLOCKS_COUNT);
	idx_t full_blocks_count = (width_as_int / PARTIAL_BLOCKS_COUNT);
	for (idx_t i = 0; i < full_blocks_count; i++) {
		used_blocks++;
		result += FULL_BLOCK;
	}

	idx_t remaining = width_as_int % PARTIAL_BLOCKS_COUNT;

	if (remaining) {
		used_blocks++;
		result += PARTIAL_BLOCKS[remaining];
	}

	const idx_t integer_max_width = (idx_t)max_width;
	if (used_blocks < integer_max_width) {
		result += std::string(integer_max_width - used_blocks, ' ');
	}
	return string_t(result);
}